

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mir-gen.c
# Opt level: O3

int add_sub_const_insn_p(gen_ctx_t gen_ctx,MIR_insn_t insn,int64_t *val)

{
  MIR_item_t pMVar1;
  MIR_module_t pMVar2;
  MIR_item_t_conflict pMVar3;
  uint uVar4;
  char *pcVar5;
  MIR_item_t_conflict pMVar6;
  int iVar7;
  int iVar8;
  
  uVar4 = *(uint *)&insn->field_0x18;
  iVar7 = 0;
  iVar8 = 0;
  if (((((ulong)uVar4 < 0x29) && (iVar8 = iVar7, (0x18c00000000U >> ((ulong)uVar4 & 0x3f) & 1) != 0)
       ) && (pMVar1 = insn[1].ops[0].u.ref, pMVar1 != (MIR_item_t)0x0)) &&
     (pMVar2 = pMVar1->module, *(char *)&pMVar2->name != '\0')) {
    if (*(char *)&insn[1].insn_link.prev == '\x02') {
      pcVar5 = MIR_reg_hard_reg_name
                         (gen_ctx->ctx,*(int *)&insn[1].insn_link.next - 0x21,
                          (gen_ctx->curr_func_item->u).func);
      if (pcVar5 != (char *)0x0) {
        return 0;
      }
      uVar4 = *(uint *)&insn->field_0x18;
    }
    pMVar3 = (pMVar2->items).tail;
    iVar8 = 1;
    pMVar6 = (MIR_item_t_conflict)-(long)pMVar3;
    if (1 < uVar4 - 0x27) {
      pMVar6 = pMVar3;
    }
    *val = (int64_t)pMVar6;
  }
  return iVar8;
}

Assistant:

static int add_sub_const_insn_p (gen_ctx_t gen_ctx, MIR_insn_t insn, int64_t *val) {
  ssa_edge_t ssa_edge;
  bb_insn_t def_bb_insn;
  // ??? , minimal gvn->val
  if (insn->code != MIR_ADD && insn->code != MIR_SUB && insn->code != MIR_ADDS
      && insn->code != MIR_SUBS)
    return FALSE;
  if ((ssa_edge = insn->ops[2].data) == NULL || !(def_bb_insn = ssa_edge->def)->gvn_val_const_p)
    return FALSE;
  MIR_func_t func = curr_func_item->u.func;
  if (insn->ops[1].mode == MIR_OP_VAR
      && MIR_reg_hard_reg_name (gen_ctx->ctx, insn->ops[1].u.var - MAX_HARD_REG, func) != NULL)
    return FALSE;
  *val = insn->code == MIR_SUB || insn->code == MIR_SUBS ? -def_bb_insn->gvn_val
                                                         : def_bb_insn->gvn_val;
  return TRUE;
}